

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3FkRequired(Parse *pParse,Table *pTab,int *aChange,int chngRowid)

{
  int iVar1;
  FKey *pFVar2;
  FKey **ppFVar3;
  uint uVar4;
  
  uVar4 = 0;
  if ((pParse->db->flags & 0x4000) != 0) {
    if (aChange == (int *)0x0) {
      pFVar2 = sqlite3FkReferences(pTab);
      if (pFVar2 == (FKey *)0x0) {
        uVar4 = (uint)(pTab->pFKey != (FKey *)0x0);
      }
      else {
        uVar4 = 1;
      }
    }
    else {
      uVar4 = 0;
      ppFVar3 = &pTab->pFKey;
      while (pFVar2 = *ppFVar3, pFVar2 != (FKey *)0x0) {
        iVar1 = sqlite3_stricmp(pTab->zName,pFVar2->zTo);
        if (iVar1 == 0) {
          return 2;
        }
        iVar1 = fkChildIsModified(pTab,pFVar2,aChange,chngRowid);
        if (iVar1 != 0) {
          uVar4 = 1;
        }
        ppFVar3 = &pFVar2->pNextFrom;
      }
      for (pFVar2 = sqlite3FkReferences(pTab); pFVar2 != (FKey *)0x0; pFVar2 = pFVar2->pNextTo) {
        iVar1 = fkParentIsModified(pTab,pFVar2,aChange,chngRowid);
        if ((iVar1 != 0) && (uVar4 = 1, pFVar2->aAction[1] != '\0')) {
          return 2;
        }
      }
    }
  }
  return uVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3FkRequired(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being modified */
  int *aChange,                   /* Non-NULL for UPDATE operations */
  int chngRowid                   /* True for UPDATE that affects rowid */
){
  int eRet = 0;
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    if( !aChange ){
      /* A DELETE operation. Foreign key processing is required if the 
      ** table in question is either the child or parent table for any 
      ** foreign key constraint.  */
      eRet = (sqlite3FkReferences(pTab) || pTab->pFKey);
    }else{
      /* This is an UPDATE. Foreign key processing is only required if the
      ** operation modifies one or more child or parent key columns. */
      FKey *p;

      /* Check if any child key columns are being modified. */
      for(p=pTab->pFKey; p; p=p->pNextFrom){
        if( 0==sqlite3_stricmp(pTab->zName, p->zTo) ) return 2;
        if( fkChildIsModified(pTab, p, aChange, chngRowid) ){
          eRet = 1;
        }
      }

      /* Check if any parent key columns are being modified. */
      for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
        if( fkParentIsModified(pTab, p, aChange, chngRowid) ){
          if( p->aAction[1]!=OE_None ) return 2;
          eRet = 1;
        }
      }
    }
  }
  return eRet;
}